

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

idx_t duckdb::ListVector::GetListSize(Vector *vec)

{
  VectorBuffer *pVVar1;
  
  for (; vec->vector_type == DICTIONARY_VECTOR; vec = DictionaryVector::Child(vec)) {
  }
  pVVar1 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vec->auxiliary);
  return (idx_t)pVVar1[1].aux_data.
                super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
}

Assistant:

idx_t ListVector::GetListSize(const Vector &vec) {
	if (vec.GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		auto &child = DictionaryVector::Child(vec);
		return ListVector::GetListSize(child);
	}
	D_ASSERT(vec.auxiliary);
	return vec.auxiliary->Cast<VectorListBuffer>().GetSize();
}